

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O2

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,double>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,double *t,double *u,
               double t2,double u2)

{
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,*t + *u);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,t2 + u2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,*u + *t);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,t2 + u2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,*t - *u);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,t2 - u2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,*u - *t);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,u2 - t2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,*t * *u);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,t2 * u2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,*u * *t);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,t2 * u2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,*t / *u);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,t2 / u2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,*u / *t);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,u2 / t2);
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u, double t2, double u2)
{
  e = t + u; evaluations_test(e, t2 + u2);
  e = u + t; evaluations_test(e, u2 + t2);
  e = t - u; evaluations_test(e, t2 - u2);
  e = u - t; evaluations_test(e, u2 - t2);
  e = t * u; evaluations_test(e, t2 * u2);
  e = u * t; evaluations_test(e, u2 * t2);
  e = t / u; evaluations_test(e, t2 / u2);
  e = u / t; evaluations_test(e, u2 / t2);
}